

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::SourcePackage::Dump(SourcePackage *this,FILE *stream)

{
  undefined8 __stream;
  char *pcVar1;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  SourcePackage *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  GenericPackage::Dump(&this->super_GenericPackage,(FILE *)identbuf._120_8_);
  __stream = identbuf._120_8_;
  pcVar1 = Kumu::UUID::EncodeString(&this->Descriptor,local_98,0x80);
  fprintf((FILE *)__stream,"  %22s = %s\n","Descriptor",pcVar1);
  return;
}

Assistant:

void
SourcePackage::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  GenericPackage::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "Descriptor", Descriptor.EncodeString(identbuf, IdentBufferLen));
}